

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastexp_test.cpp
# Opt level: O1

void __thiscall FASTEXP_BigBoth_Test::TestBody(FASTEXP_BigBoth_Test *this)

{
  bool bVar1;
  ulong lhs;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char *message;
  internal local_30 [8];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  lhs = 1;
  uVar2 = 0x26e7403e;
  uVar3 = 0x758c076b92a04e3;
  do {
    uVar2 = uVar2 % 0x1f7e9d08;
    if ((uVar3 & 1) != 0) {
      lhs = (lhs * uVar2) % 0x1f7e9d08;
    }
    uVar2 = uVar2 * uVar2;
    uVar4 = uVar3 + 1;
    uVar3 = (long)uVar3 / 2;
  } while (2 < uVar4);
  testing::internal::CmpHelperEQ
            (local_30,"fastexp(182934582734019238LL, 529384572361245923LL, 528391432)","300567920LL"
             ,lhs,0x11ea4d70);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_18);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/fastexp_test.cpp"
               ,0x1b,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
      local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FASTEXP, BigBoth) {
	EXPECT_EQ(fastexp(182934582734019238LL, 529384572361245923LL, 528391432), 300567920LL);
}